

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

void __thiscall duckdb::ART::WritePartialBlocks(ART *this,bool v1_0_0_storage)

{
  int iVar1;
  undefined4 extraout_var;
  type paVar2;
  idx_t i;
  long lVar3;
  PartialBlockManager partial_block_manager;
  
  iVar1 = (*((this->super_BoundIndex).super_Index.table_io_manager)->_vptr_TableIOManager[2])();
  PartialBlockManager::PartialBlockManager
            (&partial_block_manager,(BlockManager *)CONCAT44(extraout_var,iVar1),FULL_CHECKPOINT,
             (optional_idx)0xffffffffffffffff,0x100000);
  for (lVar3 = 0; (ulong)!v1_0_0_storage * 3 + 6 != lVar3; lVar3 = lVar3 + 1) {
    paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&this->allocators);
    FixedSizeAllocator::SerializeBuffers
              ((FixedSizeAllocator *)
               paVar2->_M_elems[lVar3].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>,&partial_block_manager);
  }
  PartialBlockManager::FlushPartialBlocks(&partial_block_manager);
  PartialBlockManager::~PartialBlockManager(&partial_block_manager);
  return;
}

Assistant:

void ART::WritePartialBlocks(const bool v1_0_0_storage) {
	auto &block_manager = table_io_manager.GetIndexBlockManager();
	PartialBlockManager partial_block_manager(block_manager, PartialBlockType::FULL_CHECKPOINT);

	idx_t allocator_count = v1_0_0_storage ? DEPRECATED_ALLOCATOR_COUNT : ALLOCATOR_COUNT;
	for (idx_t i = 0; i < allocator_count; i++) {
		(*allocators)[i]->SerializeBuffers(partial_block_manager);
	}
	partial_block_manager.FlushPartialBlocks();
}